

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O0

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxBone[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t *psVar3;
  PmxBone *__p;
  ulong uVar4;
  PmxBone *local_60;
  size_t n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0xb0),0);
  uVar4 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0xb0),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  psVar3 = (size_t *)operator_new__(uVar4);
  *psVar3 = n;
  __p = (PmxBone *)(psVar3 + 1);
  if (n != 0) {
    local_60 = __p;
    do {
      pmx::PmxBone::PmxBone(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != __p + n);
  }
  std::unique_ptr<pmx::PmxBone[],std::default_delete<pmx::PmxBone[]>>::
  unique_ptr<pmx::PmxBone*,std::default_delete<pmx::PmxBone[]>,void,bool>
            ((unique_ptr<pmx::PmxBone[],std::default_delete<pmx::PmxBone[]>> *)this,__p);
  return (__uniq_ptr_data<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }